

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O3

wchar_t f_cmp_fkind(void *a,void *b)

{
  wchar_t feat;
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  
  wVar3 = *a;
  feat = *b;
  wVar1 = feat_order(wVar3);
  wVar2 = feat_order(feat);
  if (wVar1 - wVar2 != L'\0') {
    return wVar1 - wVar2;
  }
  wVar3 = strcmp(f_info[wVar3].name,f_info[feat].name);
  return wVar3;
}

Assistant:

static int f_cmp_fkind(const void *a, const void *b)
{
	const int a_val = *(const int *)a;
	const int b_val = *(const int *)b;
	const struct feature *fa = &f_info[a_val];
	const struct feature *fb = &f_info[b_val];

	/* Group by */
	int c = feat_order(a_val) - feat_order(b_val);
	if (c) return c;

	/* Order by feature name */
	return strcmp(fa->name, fb->name);
}